

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::Expression(SQCompiler *this)

{
  long lVar1;
  long etype;
  SQFuncState *pSVar2;
  SQInteger SVar3;
  SQInteger SVar4;
  bool bVar5;
  undefined7 uVar6;
  SQInteger SVar7;
  SQInteger SVar8;
  SQInteger SVar9;
  SQInteger pos_00;
  SQInteger arg1;
  SQInteger second_exp;
  SQInteger jmppos;
  SQInteger endfirstexp;
  SQInteger first_exp;
  SQInteger trg;
  SQInteger jzpos;
  SQInteger dst_1;
  SQInteger src_1;
  SQInteger dst;
  SQInteger src;
  SQInteger pos;
  SQInteger ds;
  SQInteger op;
  SQExpState es;
  SQCompiler *this_local;
  
  bVar5 = (this->_es).donot_get;
  uVar6 = *(undefined7 *)&(this->_es).field_0x11;
  SVar3 = (this->_es).etype;
  SVar4 = (this->_es).epos;
  (this->_es).etype = 1;
  (this->_es).epos = -1;
  (this->_es).donot_get = false;
  LogicalOrExp(this);
  lVar1 = this->_token;
  if (lVar1 != 0x3d) {
    if (lVar1 == 0x3f) {
      Lex(this);
      pSVar2 = this->_fs;
      SVar7 = SQFuncState::PopTarget(this->_fs);
      SQFuncState::AddInstruction(pSVar2,_OP_JZ,SVar7,0,0,0);
      SVar7 = SQFuncState::GetCurrentPos(this->_fs);
      SVar8 = SQFuncState::PushTarget(this->_fs,-1);
      Expression(this);
      SVar9 = SQFuncState::PopTarget(this->_fs);
      if (SVar8 != SVar9) {
        SQFuncState::AddInstruction(this->_fs,_OP_MOVE,SVar8,SVar9,0,0);
      }
      SVar9 = SQFuncState::GetCurrentPos(this->_fs);
      SQFuncState::AddInstruction(this->_fs,_OP_JMP,0,0,0,0);
      Expect(this,0x3a);
      pos_00 = SQFuncState::GetCurrentPos(this->_fs);
      Expression(this);
      arg1 = SQFuncState::PopTarget(this->_fs);
      if (SVar8 != arg1) {
        SQFuncState::AddInstruction(this->_fs,_OP_MOVE,SVar8,arg1,0,0);
      }
      pSVar2 = this->_fs;
      SVar8 = SQFuncState::GetCurrentPos(this->_fs);
      SQFuncState::SetIntructionParam(pSVar2,pos_00,1,SVar8 - pos_00);
      SQFuncState::SetIntructionParam(this->_fs,SVar7,1,(SVar9 - SVar7) + 1);
      SQFuncState::SnoozeOpt(this->_fs);
      goto LAB_001b0024;
    }
    if (((lVar1 != 0x119) && (1 < lVar1 - 0x121U)) && (2 < lVar1 - 0x13dU)) goto LAB_001b0024;
  }
  lVar1 = this->_token;
  etype = (this->_es).etype;
  SVar7 = (this->_es).epos;
  if (etype == 1) {
    Error(this,"can\'t assign expression");
  }
  else if (etype == 3) {
    Error(this,"\'base\' cannot be modified");
  }
  Lex(this);
  Expression(this);
  if (lVar1 == 0x3d) {
    if (etype - 2U < 2) {
      EmitDerefOp(this,_OP_SET);
    }
    else if (etype == 4) {
      SVar7 = SQFuncState::PopTarget(this->_fs);
      SVar8 = SQFuncState::TopTarget(this->_fs);
      SQFuncState::AddInstruction(this->_fs,_OP_MOVE,SVar8,SVar7,0,0);
    }
    else if (etype == 5) {
      SVar8 = SQFuncState::PopTarget(this->_fs);
      SVar9 = SQFuncState::PushTarget(this->_fs,-1);
      SQFuncState::AddInstruction(this->_fs,_OP_SETOUTER,SVar9,SVar7,SVar8,0);
    }
  }
  else if (lVar1 == 0x119) {
    if ((etype == 2) || (etype == 3)) {
      EmitDerefOp(this,_OP_NEWSLOT);
    }
    else {
      Error(this,"can\'t \'create\' a local slot");
    }
  }
  else if ((lVar1 - 0x121U < 2) || (lVar1 - 0x13dU < 3)) {
    EmitCompoundArith(this,lVar1,etype,SVar7);
  }
LAB_001b0024:
  (this->_es).etype = SVar3;
  (this->_es).epos = SVar4;
  (this->_es).donot_get = bVar5;
  *(undefined7 *)&(this->_es).field_0x11 = uVar6;
  return;
}

Assistant:

void Expression()
    {
         SQExpState es = _es;
        _es.etype     = EXPR;
        _es.epos      = -1;
        _es.donot_get = false;
        LogicalOrExp();
        switch(_token)  {
        case _SC('='):
        case TK_NEWSLOT:
        case TK_MINUSEQ:
        case TK_PLUSEQ:
        case TK_MULEQ:
        case TK_DIVEQ:
        case TK_MODEQ:{
            SQInteger op = _token;
            SQInteger ds = _es.etype;
            SQInteger pos = _es.epos;
            if(ds == EXPR) Error(_SC("can't assign expression"));
            else if(ds == BASE) Error(_SC("'base' cannot be modified"));
            Lex(); Expression();

            switch(op){
            case TK_NEWSLOT:
                if(ds == OBJECT || ds == BASE)
                    EmitDerefOp(_OP_NEWSLOT);
                else //if _derefstate != DEREF_NO_DEREF && DEREF_FIELD so is the index of a local
                    Error(_SC("can't 'create' a local slot"));
                break;
            case _SC('='): //ASSIGN
                switch(ds) {
                case LOCAL:
                    {
                        SQInteger src = _fs->PopTarget();
                        SQInteger dst = _fs->TopTarget();
                        _fs->AddInstruction(_OP_MOVE, dst, src);
                    }
                    break;
                case OBJECT:
                case BASE:
                    EmitDerefOp(_OP_SET);
                    break;
                case OUTER:
                    {
                        SQInteger src = _fs->PopTarget();
                        SQInteger dst = _fs->PushTarget();
                        _fs->AddInstruction(_OP_SETOUTER, dst, pos, src);
                    }
                }
                break;
            case TK_MINUSEQ:
            case TK_PLUSEQ:
            case TK_MULEQ:
            case TK_DIVEQ:
            case TK_MODEQ:
                EmitCompoundArith(op, ds, pos);
                break;
            }
            }
            break;
        case _SC('?'): {
            Lex();
            _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
            SQInteger jzpos = _fs->GetCurrentPos();
            SQInteger trg = _fs->PushTarget();
            Expression();
            SQInteger first_exp = _fs->PopTarget();
            if(trg != first_exp) _fs->AddInstruction(_OP_MOVE, trg, first_exp);
            SQInteger endfirstexp = _fs->GetCurrentPos();
            _fs->AddInstruction(_OP_JMP, 0, 0);
            Expect(_SC(':'));
            SQInteger jmppos = _fs->GetCurrentPos();
            Expression();
            SQInteger second_exp = _fs->PopTarget();
            if(trg != second_exp) _fs->AddInstruction(_OP_MOVE, trg, second_exp);
            _fs->SetIntructionParam(jmppos, 1, _fs->GetCurrentPos() - jmppos);
            _fs->SetIntructionParam(jzpos, 1, endfirstexp - jzpos + 1);
            _fs->SnoozeOpt();
            }
            break;
        }
        _es = es;
    }